

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O1

void __thiscall sc_core::sc_trace_file_base::~sc_trace_file_base(sc_trace_file_base *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

sc_trace_file_base::~sc_trace_file_base()
{
    if( !is_initialized() )
        SC_REPORT_WARNING( SC_ID_TRACING_CLOSE_EMPTY_FILE_, filename() );

    if( fp )
        fclose(fp);

#if SC_TRACING_PHASE_CALLBACKS_ == 0
    // unregister from simcontext
    sc_get_curr_simcontext()->remove_trace_file( this );
#endif
}